

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O1

void capnp::compiler::parseFile
               (Reader statements,Builder result,ErrorReporter *errorReporter,bool requiresId)

{
  short sVar1;
  StructBuilder other;
  StructBuilder other_00;
  Reader statement_00;
  undefined8 uVar2;
  undefined8 uVar3;
  Orphan<capnp::compiler::Declaration> *pOVar4;
  RemoveConst<capnp::Orphan<capnp::compiler::Declaration>_> *pRVar5;
  Orphan<capnp::compiler::Declaration> *pOVar6;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *pOVar7;
  void *pvVar8;
  WirePointer *pWVar9;
  PointerType PVar10;
  int iVar11;
  BuilderArena *pBVar12;
  CapTableBuilder *pCVar13;
  WirePointer i;
  SegmentBuilder *pSVar14;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *ptrCopy;
  ElementCount EVar15;
  long lVar16;
  undefined7 in_register_00000031;
  size_t sVar17;
  char (*params_2) [2];
  ulong uVar18;
  ulong uVar19;
  ElementCount index;
  Orphanage orphanageParam;
  Vector<capnp::Orphan<capnp::compiler::Declaration>_> decls;
  Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> annotations;
  Builder declsBuilder;
  Builder annotationsBuilder;
  Builder fileDecl;
  Reader statement;
  CapnpParser parser;
  undefined1 local_328 [16];
  SegmentBuilder *pSStack_318;
  WirePointer *pWStack_310;
  word *pwStack_308;
  Vector<capnp::Orphan<capnp::compiler::Declaration>_> local_2f8;
  OrphanBuilder local_2d8;
  Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> local_2b8;
  bool local_298 [8];
  anon_union_32_1_a8c68091_for_NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>_2
  aStack_290;
  undefined1 local_270 [40];
  ErrorReporter *local_248;
  undefined4 local_240;
  ElementCount local_23c;
  StructBuilder local_238;
  PointerBuilder local_210;
  StructReader local_1f8;
  CapnpParser local_1c8;
  
  local_1f8.dataSize = result._builder.dataSize;
  local_1f8.pointerCount = result._builder.pointerCount;
  local_1f8._38_2_ = result._builder._38_2_;
  local_1f8.data = result._builder.data;
  local_1f8.pointers = result._builder.pointers;
  local_1f8.segment = &(result._builder.segment)->super_SegmentReader;
  local_1f8.capTable = &(result._builder.capTable)->super_CapTableReader;
  pBVar12 = capnp::_::StructBuilder::getArena((StructBuilder *)&local_1f8);
  pCVar13 = capnp::_::StructBuilder::getCapTable((StructBuilder *)&local_1f8);
  orphanageParam.capTable = pCVar13;
  orphanageParam.arena = pBVar12;
  local_248 = errorReporter;
  CapnpParser::CapnpParser(&local_1c8,orphanageParam,errorReporter);
  uVar18 = (ulong)statements.reader.elementCount;
  params_2 = (char (*) [2])0x0;
  local_2f8.builder.ptr =
       (Orphan<capnp::compiler::Declaration> *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x20,0,uVar18,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_240 = (undefined4)CONCAT71(in_register_00000031,requiresId);
  local_2f8.builder.endPtr = local_2f8.builder.ptr + uVar18;
  local_2f8.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_2b8.builder.ptr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  local_2b8.builder.pos = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  local_2b8.builder.endPtr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
  local_2b8.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  local_1f8.segment = &(result._builder.segment)->super_SegmentReader;
  local_1f8.capTable = &(result._builder.capTable)->super_CapTableReader;
  local_1f8.data = result._builder.pointers;
  local_2f8.builder.pos = local_2f8.builder.ptr;
  capnp::_::PointerBuilder::getStruct
            (&local_238,(PointerBuilder *)&local_1f8,(StructSize)0x80002,(word *)0x0);
  *(short *)((long)local_238.data + 2) = 0;
  if (statements.reader.elementCount != 0) {
    index = 0;
    local_23c = statements.reader.elementCount;
    EVar15 = statements.reader.elementCount;
    do {
      capnp::_::ListReader::getStructElement(&local_1f8,&statements.reader,index);
      statement_00._reader.capTable = local_1f8.capTable;
      statement_00._reader.segment = local_1f8.segment;
      statement_00._reader.data = local_1f8.data;
      statement_00._reader.pointers = local_1f8.pointers;
      statement_00._reader.dataSize = local_1f8.dataSize;
      statement_00._reader.pointerCount = local_1f8.pointerCount;
      statement_00._reader._38_2_ = local_1f8._38_2_;
      statement_00._reader.nestingLimit = local_1f8.nestingLimit;
      statement_00._reader._44_4_ = local_1f8._44_4_;
      CapnpParser::parseStatement
                ((Maybe<capnp::Orphan<capnp::compiler::Declaration>_> *)local_298,&local_1c8,
                 statement_00,&local_1c8.parsers.fileLevelDecl);
      local_328[0] = local_298[0];
      if (local_298[0] == true) {
        pWStack_310 = (WirePointer *)aStack_290.value.builder.capTable;
        pwStack_308 = aStack_290.value.builder.location;
        local_328._8_8_ = aStack_290.value.builder.tag.content;
        pSStack_318 = aStack_290.value.builder.segment;
        aStack_290.value.builder.segment = (SegmentBuilder *)0x0;
        aStack_290.value.builder.location = (word *)0x0;
      }
      if ((local_298[0] != false) && (aStack_290.value.builder.segment != (SegmentBuilder *)0x0)) {
        capnp::_::OrphanBuilder::euthanize(&aStack_290.value.builder);
      }
      if (local_328[0] == '\x01') {
        capnp::_::OrphanBuilder::asStruct
                  ((StructBuilder *)local_298,(OrphanBuilder *)(local_328 + 8),(StructSize)0x80002);
        pWVar9 = local_238.pointers;
        pvVar8 = local_238.data;
        pCVar13 = local_238.capTable;
        pSVar14 = local_238.segment;
        sVar1 = *(short *)((long)&((aStack_290.value.builder.segment)->super_SegmentReader).arena +
                          2);
        if (sVar1 == 0xc) {
          if (*local_238.data == 1) {
            params_2 = (char (*) [2])0x1b;
            (**local_248->_vptr_ErrorReporter)
                      (local_248,
                       (ulong)*(uint *)((long)&((aStack_290.value.builder.segment)->
                                               super_SegmentReader).arena + 4),
                       (ulong)((aStack_290.value.builder.segment)->super_SegmentReader).id.value);
          }
          else {
            local_210.pointer = (WirePointer *)(aStack_290.value.builder.capTable + 5);
            local_210.capTable = (CapTableBuilder *)aStack_290.value.builder.tag.content;
            capnp::_::PointerBuilder::disown((OrphanBuilder *)local_270,&local_210);
            local_2d8.capTable = (CapTableBuilder *)local_270._16_8_;
            local_2d8.location = (word *)local_270._24_8_;
            local_2d8.tag.content = local_270._0_8_;
            local_2d8.segment = (SegmentBuilder *)local_270._8_8_;
            *(short *)pvVar8 = 1;
            local_270._16_8_ = pWVar9 + 1;
            local_270._0_8_ = pSVar14;
            local_270._8_8_ = pCVar13;
            capnp::_::PointerBuilder::adopt((PointerBuilder *)local_270,&local_2d8);
            if (local_2d8.segment != (SegmentBuilder *)0x0) {
              capnp::_::OrphanBuilder::euthanize(&local_2d8);
            }
            local_270._0_8_ = CONCAT71(local_298._1_7_,local_298[0]);
            local_270._16_8_ = aStack_290.value.builder.capTable + 4;
            local_270._8_8_ = aStack_290.value.builder.tag.content;
            PVar10 = capnp::_::PointerBuilder::getPointerType((PointerBuilder *)local_270);
            EVar15 = local_23c;
            if (PVar10 != NULL_) {
              local_210.pointer = (WirePointer *)(aStack_290.value.builder.capTable + 4);
              local_210.capTable = (CapTableBuilder *)aStack_290.value.builder.tag.content;
              capnp::_::PointerBuilder::disown((OrphanBuilder *)local_270,&local_210);
              local_2d8.capTable = (CapTableBuilder *)local_270._16_8_;
              local_2d8.location = (word *)local_270._24_8_;
              local_2d8.tag.content = local_270._0_8_;
              local_2d8.segment = (SegmentBuilder *)local_270._8_8_;
              local_270._16_8_ = local_238.pointers + 4;
              local_270._0_8_ = local_238.segment;
              local_270._8_8_ = local_238.capTable;
              capnp::_::PointerBuilder::adopt((PointerBuilder *)local_270,&local_2d8);
              if (local_2d8.segment != (SegmentBuilder *)0x0) {
                capnp::_::OrphanBuilder::euthanize(&local_2d8);
              }
            }
          }
        }
        else if (sVar1 == 0xd) {
          local_210.pointer = (WirePointer *)(aStack_290.value.builder.capTable + 5);
          local_210.capTable = (CapTableBuilder *)aStack_290.value.builder.tag.content;
          capnp::_::PointerBuilder::disown((OrphanBuilder *)local_270,&local_210);
          local_2d8.capTable = (CapTableBuilder *)local_270._16_8_;
          local_2d8.location = (word *)local_270._24_8_;
          local_2d8.tag.content = local_270._0_8_;
          local_2d8.segment = (SegmentBuilder *)local_270._8_8_;
          if (local_2b8.builder.pos == local_2b8.builder.endPtr) {
            sVar17 = (long)local_2b8.builder.endPtr - (long)local_2b8.builder.ptr >> 4;
            if (local_2b8.builder.endPtr == local_2b8.builder.ptr) {
              sVar17 = 4;
            }
            kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::
            setCapacity(&local_2b8,sVar17);
          }
          ((local_2b8.builder.pos)->builder).segment = local_2d8.segment;
          ((local_2b8.builder.pos)->builder).capTable = local_2d8.capTable;
          ((local_2b8.builder.pos)->builder).location = local_2d8.location;
          ((local_2b8.builder.pos)->builder).tag.content = local_2d8.tag.content;
          local_2b8.builder.pos = local_2b8.builder.pos + 1;
        }
        else {
          if (local_2f8.builder.pos == local_2f8.builder.endPtr) {
            sVar17 = (long)local_2f8.builder.endPtr - (long)local_2f8.builder.ptr >> 4;
            if (local_2f8.builder.endPtr == local_2f8.builder.ptr) {
              sVar17 = 4;
            }
            kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::setCapacity(&local_2f8,sVar17)
            ;
          }
          ((local_2f8.builder.pos)->builder).segment = pSStack_318;
          ((local_2f8.builder.pos)->builder).capTable = (CapTableBuilder *)pWStack_310;
          ((local_2f8.builder.pos)->builder).location = pwStack_308;
          ((local_2f8.builder.pos)->builder).tag.content = local_328._8_8_;
          pSStack_318 = (SegmentBuilder *)0x0;
          pwStack_308 = (word *)0x0;
          local_2f8.builder.pos = local_2f8.builder.pos + 1;
        }
      }
      if ((local_328[0] == '\x01') && (pSStack_318 != (SegmentBuilder *)0x0)) {
        capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(local_328 + 8));
      }
      index = index + 1;
    } while (EVar15 != index);
  }
  if (*local_238.data != 1) {
    i = (WirePointer)generateRandomId();
    *(short *)local_238.data = 1;
    pSStack_318 = (SegmentBuilder *)(local_238.pointers + 1);
    local_328._0_8_ = local_238.segment;
    local_328._8_8_ = local_238.capTable;
    capnp::_::PointerBuilder::initStruct
              ((StructBuilder *)&local_1f8,(PointerBuilder *)local_328,(StructSize)0x2);
    *(WirePointer *)local_1f8.data = i;
    if (((char)local_240 != '\0') &&
       (iVar11 = (*local_248->_vptr_ErrorReporter[1])(), (char)iVar11 == '\0')) {
      kj::hex((CappedArray<char,_17UL> *)&local_1f8,(unsigned_long)i);
      kj::str<char_const(&)[91],kj::CappedArray<char,17ul>,char_const(&)[2]>
                ((String *)local_328,
                 (kj *)
                 "File does not declare an ID.  I\'ve generated one for you.  Add this line to your file: @0x"
                 ,(char (*) [91])&local_1f8,(CappedArray<char,_17UL> *)";",params_2);
      pSVar14 = (SegmentBuilder *)local_328._0_8_;
      if ((SegmentBuilder *)local_328._8_8_ == (SegmentBuilder *)0x0) {
        pSVar14 = (SegmentBuilder *)0x1e253d;
      }
      (**local_248->_vptr_ErrorReporter)
                (local_248,0,0,pSVar14,
                 (long)&((SegmentReader *)local_328._8_8_)->arena +
                 (ulong)((SegmentBuilder *)local_328._8_8_ == (SegmentBuilder *)0x0));
      uVar3 = local_328._8_8_;
      uVar2 = local_328._0_8_;
      if ((SegmentBuilder *)local_328._0_8_ != (SegmentBuilder *)0x0) {
        local_328._0_8_ = (SegmentBuilder *)0x0;
        local_328._8_8_ = (SegmentBuilder *)0x0;
        (*(code *)((pSStack_318->super_SegmentReader).arena)->_vptr_Arena)
                  (pSStack_318,uVar2,1,uVar3,uVar3,0);
      }
    }
  }
  local_1f8.data = local_238.pointers + 2;
  local_1f8.segment = &(local_238.segment)->super_SegmentReader;
  local_1f8.capTable = &(local_238.capTable)->super_CapTableReader;
  capnp::_::PointerBuilder::initStructList
            ((ListBuilder *)local_298,(PointerBuilder *)&local_1f8,
             (ElementCount)((ulong)((long)local_2f8.builder.pos - (long)local_2f8.builder.ptr) >> 5)
             ,(StructSize)0x80002);
  if (local_2f8.builder.pos != local_2f8.builder.ptr) {
    lVar16 = 0;
    uVar18 = 0;
    do {
      pOVar4 = local_2f8.builder.ptr;
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)&local_1f8,(ListBuilder *)local_298,(ElementCount)uVar18);
      capnp::_::OrphanBuilder::asStruct
                ((StructBuilder *)local_328,
                 (OrphanBuilder *)((long)&(pOVar4->builder).tag.content + lVar16),(StructSize)0x0);
      other.capTable = (CapTableBuilder *)local_328._8_8_;
      other.segment = (SegmentBuilder *)local_328._0_8_;
      other.data = pSStack_318;
      other.pointers = pWStack_310;
      other._32_8_ = pwStack_308;
      capnp::_::StructBuilder::transferContentFrom((StructBuilder *)&local_1f8,other);
      uVar18 = uVar18 + 1;
      lVar16 = lVar16 + 0x20;
    } while (uVar18 < (ulong)((long)local_2f8.builder.pos - (long)local_2f8.builder.ptr >> 5));
  }
  local_1f8.data = local_238.pointers + 3;
  local_1f8.segment = &(local_238.segment)->super_SegmentReader;
  local_1f8.capTable = &(local_238.capTable)->super_CapTableReader;
  capnp::_::PointerBuilder::initStructList
            ((ListBuilder *)local_270,(PointerBuilder *)&local_1f8,
             (ElementCount)((ulong)((long)local_2b8.builder.pos - (long)local_2b8.builder.ptr) >> 5)
             ,(StructSize)0x20001);
  if (local_2b8.builder.pos == local_2b8.builder.ptr) {
    uVar18 = 0;
  }
  else {
    lVar16 = 0;
    uVar19 = 0;
    do {
      pOVar7 = local_2b8.builder.ptr;
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)&local_1f8,(ListBuilder *)local_270,(ElementCount)uVar19);
      capnp::_::OrphanBuilder::asStruct
                ((StructBuilder *)local_328,
                 (OrphanBuilder *)((long)&(pOVar7->builder).tag.content + lVar16),(StructSize)0x0);
      other_00.capTable = (CapTableBuilder *)local_328._8_8_;
      other_00.segment = (SegmentBuilder *)local_328._0_8_;
      other_00.data = pSStack_318;
      other_00.pointers = pWStack_310;
      other_00._32_8_ = pwStack_308;
      capnp::_::StructBuilder::transferContentFrom((StructBuilder *)&local_1f8,other_00);
      uVar19 = uVar19 + 1;
      uVar18 = (long)local_2b8.builder.pos - (long)local_2b8.builder.ptr >> 5;
      lVar16 = lVar16 + 0x20;
    } while (uVar19 < uVar18);
  }
  pOVar7 = local_2b8.builder.ptr;
  if (local_2b8.builder.ptr != (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0) {
    local_2b8.builder.ptr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
    local_2b8.builder.pos = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
    lVar16 = (long)local_2b8.builder.endPtr - (long)pOVar7;
    local_2b8.builder.endPtr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
    (*(code *)**(undefined8 **)local_2b8.builder.disposer)
              (local_2b8.builder.disposer,pOVar7,0x20,uVar18,lVar16 >> 5,
               kj::ArrayDisposer::
               Dispose_<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::
               destruct);
  }
  pOVar6 = local_2f8.builder.endPtr;
  pRVar5 = local_2f8.builder.pos;
  pOVar4 = local_2f8.builder.ptr;
  if (local_2f8.builder.ptr != (Orphan<capnp::compiler::Declaration> *)0x0) {
    local_2f8.builder.ptr = (Orphan<capnp::compiler::Declaration> *)0x0;
    local_2f8.builder.pos = (Orphan<capnp::compiler::Declaration> *)0x0;
    local_2f8.builder.endPtr = (Orphan<capnp::compiler::Declaration> *)0x0;
    (*(code *)**(undefined8 **)local_2f8.builder.disposer)
              (local_2f8.builder.disposer,pOVar4,0x20,(long)pRVar5 - (long)pOVar4 >> 5,
               (long)pOVar6 - (long)pOVar4 >> 5,
               kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Declaration>_>::destruct);
  }
  kj::Arena::~Arena(&local_1c8.arena);
  return;
}

Assistant:

void parseFile(List<Statement>::Reader statements, ParsedFile::Builder result,
               ErrorReporter& errorReporter, bool requiresId) {
  CapnpParser parser(Orphanage::getForMessageContaining(result), errorReporter);

  kj::Vector<Orphan<Declaration>> decls(statements.size());
  kj::Vector<Orphan<Declaration::AnnotationApplication>> annotations;

  auto fileDecl = result.getRoot();
  fileDecl.setFile(VOID);

  for (auto statement: statements) {
    KJ_IF_SOME(decl, parser.parseStatement(statement, parser.getParsers().fileLevelDecl)) {
      Declaration::Builder builder = decl.get();
      switch (builder.which()) {
        case Declaration::NAKED_ID:
          if (fileDecl.getId().isUid()) {
            errorReporter.addError(builder.getStartByte(), builder.getEndByte(),
                                   "File can only have one ID.");
          } else {
            fileDecl.getId().adoptUid(builder.disownNakedId());
            if (builder.hasDocComment()) {
              fileDecl.adoptDocComment(builder.disownDocComment());
            }
          }
          break;
        case Declaration::NAKED_ANNOTATION:
          annotations.add(builder.disownNakedAnnotation());
          break;
        default:
          decls.add(kj::mv(decl));
          break;
      }
    }
  }

  if (fileDecl.getId().which() != Declaration::Id::UID) {
    // We didn't see an ID. Generate one randomly for now.
    uint64_t id = generateRandomId();
    fileDecl.getId().initUid().setValue(id);

    // Don't report missing ID if there was a parse error, because quite often the parse error
    // prevents us from parsing the ID even though it is actually there.
    if (requiresId && !errorReporter.hadErrors()) {
      errorReporter.addError(0, 0,
          kj::str("File does not declare an ID.  I've generated one for you.  Add this line to "
                  "your file: @0x", kj::hex(id), ";"));
    }
  }

  auto declsBuilder = fileDecl.initNestedDecls(decls.size());
  for (size_t i = 0; i < decls.size(); i++) {
    declsBuilder.adoptWithCaveats(i, kj::mv(decls[i]));
  }

  auto annotationsBuilder = fileDecl.initAnnotations(annotations.size());
  for (size_t i = 0; i < annotations.size(); i++) {
    annotationsBuilder.adoptWithCaveats(i, kj::mv(annotations[i]));
  }
}